

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureWeight *this)

{
  int iVar1;
  uint uVar2;
  Type *value;
  size_t sVar3;
  uint i;
  uint index;
  ulong uVar4;
  
  uVar2 = (this->weights_).super_RepeatedPtrFieldBase.current_size_;
  uVar4 = (ulong)uVar2;
  for (index = 0; uVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::TypeHandler>
                      (&(this->weights_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>
                      (value);
    uVar4 = uVar4 + sVar3;
  }
  if (this->featureid_ != 0) {
    uVar2 = this->featureid_ | 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar4 = uVar4 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)uVar4;
  return uVar4;
}

Assistant:

size_t BayesianProbitRegressor_FeatureWeight::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  size_t total_size = 0;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight weights = 2;
  {
    unsigned int count = this->weights_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->weights(i));
    }
  }

  // uint32 featureId = 1;
  if (this->featureid() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->featureid());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}